

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O3

bool __thiscall
IRT::ConstPlusRegPattern::TryToGenerateCode
          (ConstPlusRegPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  TOperationType TVar1;
  int iVar2;
  CBinopExpression *this_00;
  CExpression *pCVar3;
  CConstExpression *this_01;
  CTempExpression *this_02;
  CTemp *__args_1;
  INode *pIVar4;
  CTemp rightRegister;
  undefined1 local_a8 [32];
  INode *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 local_70;
  _Alloc_hider _Stack_68;
  INode *local_60;
  undefined1 local_58 [16];
  _Alloc_hider local_48;
  undefined1 local_40 [16];
  
  if (tree != (INode *)0x0) {
    this_00 = (CBinopExpression *)
              __dynamic_cast(tree,&INode::typeinfo,&CBinopExpression::typeinfo,0);
    if (this_00 == (CBinopExpression *)0x0) {
      return false;
    }
    TVar1 = CBinopExpression::getOperation(this_00);
    if ((TVar1 == PLUS) &&
       (pCVar3 = CBinopExpression::getLeftOperand(this_00), pCVar3 != (CExpression *)0x0)) {
      this_01 = (CConstExpression *)
                __dynamic_cast(pCVar3,&CExpression::typeinfo,&CConstExpression::typeinfo,0);
      if (this_01 != (CConstExpression *)0x0) {
        pCVar3 = CBinopExpression::getRightOperand(this_00);
        if ((pCVar3 == (CExpression *)0x0) ||
           (this_02 = (CTempExpression *)
                      __dynamic_cast(pCVar3,&CExpression::typeinfo,&CTempExpression::typeinfo,0),
           this_02 == (CTempExpression *)0x0)) {
          CTemp::CTemp((CTemp *)(local_58 + 8));
          pIVar4 = (INode *)CBinopExpression::getLeftOperand(this_00);
          local_80._M_allocated_capacity = (size_type)(MoveRegRegCommand *)&local_70;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,local_58._8_8_,local_48._M_p + local_58._8_8_);
          if ((MoveRegRegCommand *)local_80._M_allocated_capacity == (MoveRegRegCommand *)&local_70)
          {
            local_a8._24_8_ = _Stack_68._M_p;
            local_a8._0_8_ = (MoveRegRegCommand *)(local_a8 + 0x10);
          }
          else {
            local_a8._0_8_ = local_80._M_allocated_capacity;
          }
          local_a8._8_8_ = local_80._8_8_;
          local_80._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_70 = 0;
          local_88 = pIVar4;
          local_80._M_allocated_capacity = (size_type)(MoveRegRegCommand *)&local_70;
          local_60 = pIVar4;
          local_58._0_8_ = this_01;
          std::
          vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
          ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                    ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                      *)children,(pair<IRT::CTemp,_const_IRT::INode_*> *)local_a8);
          if ((MoveRegRegCommand *)local_a8._0_8_ != (MoveRegRegCommand *)(local_a8 + 0x10)) {
            operator_delete((void *)local_a8._0_8_);
          }
          this_01 = (CConstExpression *)local_58._0_8_;
          if ((MoveRegRegCommand *)local_80._M_allocated_capacity != (MoveRegRegCommand *)&local_70)
          {
            operator_delete((void *)local_80._M_allocated_capacity);
          }
          local_a8._0_8_ = (MoveRegRegCommand *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<AssemblyCode::MoveRegRegCommand,std::allocator<AssemblyCode::MoveRegRegCommand>,IRT::CTemp_const&,IRT::CTemp&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),
                     (MoveRegRegCommand **)local_a8,
                     (allocator<AssemblyCode::MoveRegRegCommand> *)&local_80,dest,
                     (CTemp *)(local_58 + 8));
          std::
          vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
          ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                    ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                      *)commands,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_a8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
          }
          if ((undefined1 *)local_58._8_8_ != local_40) {
            operator_delete((void *)local_58._8_8_);
          }
        }
        else {
          __args_1 = CTempExpression::getTemprorary(this_02);
          local_a8._0_8_ = (MoveRegRegCommand *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<AssemblyCode::MoveRegRegCommand,std::allocator<AssemblyCode::MoveRegRegCommand>,IRT::CTemp_const&,IRT::CTemp_const&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),
                     (MoveRegRegCommand **)local_a8,
                     (allocator<AssemblyCode::MoveRegRegCommand> *)&local_80,dest,__args_1);
          std::
          vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
          ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                    ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                      *)commands,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_a8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
          }
        }
        iVar2 = CConstExpression::getValue(this_01);
        local_80._M_allocated_capacity._0_4_ = iVar2;
        local_a8._0_8_ = (MoveRegRegCommand *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<AssemblyCode::AddRegConstCommand,std::allocator<AssemblyCode::AddRegConstCommand>,IRT::CTemp_const&,int>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),
                   (AddRegConstCommand **)local_a8,
                   (allocator<AssemblyCode::AddRegConstCommand> *)(local_58 + 8),dest,
                   (int *)local_80._M_local_buf);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::AddRegConstCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::AddRegConstCommand> *)local_a8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        return true;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool
IRT::ConstPlusRegPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                             AssemblyCommands &commands ) {
    ConstBinopPtr binopPtr = dynamic_cast<ConstBinopPtr>(tree);
    if ( binopPtr && binopPtr->getOperation( ) == IRT::enums::TOperationType::PLUS ) {
        ConstConstPtr constPtr = dynamic_cast<ConstConstPtr>(binopPtr->getLeftOperand( ));
        if ( constPtr ) {
            ConstTempPtr rightRegisterPtr = dynamic_cast<ConstTempPtr>(binopPtr->getRightOperand( ));
            if ( rightRegisterPtr ) {
                commands.emplace_back(
                        std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, rightRegisterPtr->getTemprorary( )));
            } else {
                CTemp rightRegister;
                children.push_back( std::make_pair( rightRegister, binopPtr->getLeftOperand( )));
                commands.emplace_back( std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, rightRegister ));
            }
            commands.emplace_back( std::make_shared<AssemblyCode::AddRegConstCommand>( dest, constPtr->getValue( )));
            return true;
        }
    }
    return false;
}